

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O0

void __thiscall
ScriptElement_NumConstructorWitTestVector_Test::~ScriptElement_NumConstructorWitTestVector_Test
          (ScriptElement_NumConstructorWitTestVector_Test *this)

{
  ScriptElement_NumConstructorWitTestVector_Test *this_local;
  
  ~ScriptElement_NumConstructorWitTestVector_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptElement, NumConstructorWitTestVector) {
  for (const NumberElementTestCase& test_case : test_vector) {
    ScriptElement elem = ScriptElement(test_case.input);

    EXPECT_TRUE(elem.IsNumber());
    EXPECT_EQ(test_case.input, elem.GetNumber());
    EXPECT_EQ(test_case.expect_op_code, elem.GetOpCode());
    EXPECT_STREQ(test_case.expect_data.c_str(),
                 elem.GetData().GetHex().c_str());
  }
}